

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_BufCreateEdges(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint i;
  float fVar3;
  int local_54;
  Mio_Gate_t *local_30;
  Mio_Gate_t *pGate;
  int k;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  iVar2 = Abc_ObjIsCo(pObj);
  if (iVar2 == 0) {
    local_30 = (Mio_Gate_t *)(pObj->field_5).pData;
  }
  else {
    local_30 = (Mio_Gate_t *)0x0;
  }
  pVVar1 = p->vOffsets;
  i = Abc_ObjId(pObj);
  iVar2 = Vec_IntSize(p->vEdges);
  Vec_IntWriteEntry(pVVar1,i,iVar2);
  pGate._4_4_ = 0;
  while( true ) {
    iVar2 = Abc_ObjFaninNum(pObj);
    if (iVar2 <= pGate._4_4_) break;
    pVVar1 = p->vEdges;
    if (local_30 == (Mio_Gate_t *)0x0) {
      local_54 = 0;
    }
    else {
      fVar3 = Mio_GateReadPinDelay(local_30,pGate._4_4_);
      local_54 = (int)((fVar3 * 1000.0) / p->DelayInv);
    }
    Vec_IntPush(pVVar1,local_54);
    pGate._4_4_ = pGate._4_4_ + 1;
  }
  return;
}

Assistant:

void Abc_BufCreateEdges( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    int k;
    Mio_Gate_t * pGate = Abc_ObjIsCo(pObj) ? NULL : (Mio_Gate_t *)pObj->pData;
    Vec_IntWriteEntry( p->vOffsets, Abc_ObjId(pObj), Vec_IntSize(p->vEdges) );
    for ( k = 0; k < Abc_ObjFaninNum(pObj); k++ )
        Vec_IntPush( p->vEdges, pGate ? (int)(1.0 * BUF_SCALE * Mio_GateReadPinDelay(pGate, k) / p->DelayInv) : 0 );
}